

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  allocator<char> local_69;
  string local_68;
  ThreadFunc local_48;
  _Bind<void_(EventLoopThread::*(EventLoopThread_*))()> local_28;
  
  this->loop_ = (EventLoop *)0x0;
  this->exiting_ = false;
  local_28._M_f = (offset_in_EventLoopThread_to_subr)threadFunc;
  local_28._8_8_ = 0;
  local_28._M_bound_args.super__Tuple_impl<0UL,_EventLoopThread_*>.
  super__Head_base<0UL,_EventLoopThread_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_EventLoopThread_*>)(_Tuple_impl<0UL,_EventLoopThread_*>)this;
  std::function<void()>::function<std::_Bind<void(EventLoopThread::*(EventLoopThread*))()>,void>
            ((function<void()> *)&local_48,&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EventLoopThread",&local_69);
  Thread::Thread(&this->thread_,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  MutexLock::MutexLock(&this->mutex_);
  Condition::Condition(&this->cond_,&this->mutex_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
        : loop_(nullptr),
        exiting_(false),
        thread_(bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
        mutex_(),
        cond_(mutex_) {  }